

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.h
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1b0fcc::FloatExpr<float>::printLeft(FloatExpr<float> *this,OutputStream *s)

{
  undefined1 uVar1;
  char *pcVar2;
  int iVar3;
  float *pfVar4;
  float *pfVar5;
  long lVar6;
  char cVar7;
  size_t N;
  anon_union_4_2_325080ff anon_var_0;
  char num [24];
  undefined1 local_2d;
  float local_2c;
  char local_28 [24];
  
  pcVar2 = (this->Contents).First;
  if ((char *)0x8 < (this->Contents).Last + (1 - (long)pcVar2)) {
    lVar6 = 0;
    pfVar5 = (float *)&local_2d;
    do {
      pfVar4 = pfVar5;
      cVar7 = -0x57;
      if ((int)pcVar2[lVar6 + 1] - 0x30U < 10) {
        cVar7 = -0x30;
      }
      *(char *)((long)pfVar4 + 1) =
           ((9 < (int)pcVar2[lVar6] - 0x30U) * '\t' + pcVar2[lVar6]) * '\x10' +
           cVar7 + pcVar2[lVar6 + 1];
      lVar6 = lVar6 + 2;
      pfVar5 = (float *)((long)pfVar4 + 1);
    } while (lVar6 != 8);
    pfVar5 = &local_2c;
    if (pfVar5 < (float *)((long)pfVar4 + 1)) {
      lVar6 = -1;
      do {
        uVar1 = *(undefined1 *)pfVar5;
        *(undefined1 *)pfVar5 = *(undefined1 *)((long)pfVar4 + lVar6 + 2);
        *(undefined1 *)((long)pfVar4 + lVar6 + 2) = uVar1;
        lVar6 = lVar6 + -1;
        pfVar5 = (float *)((long)pfVar5 + 1);
      } while (lVar6 != -3);
    }
    local_28[0] = '\0';
    local_28[1] = '\0';
    local_28[2] = '\0';
    local_28[3] = '\0';
    local_28[4] = '\0';
    local_28[5] = '\0';
    local_28[6] = '\0';
    local_28[7] = '\0';
    local_28[8] = '\0';
    local_28[9] = '\0';
    local_28[10] = '\0';
    local_28[0xb] = '\0';
    local_28[0xc] = '\0';
    local_28[0xd] = '\0';
    local_28[0xe] = '\0';
    local_28[0xf] = '\0';
    local_28[0x10] = '\0';
    local_28[0x11] = '\0';
    local_28[0x12] = '\0';
    local_28[0x13] = '\0';
    local_28[0x14] = '\0';
    local_28[0x15] = '\0';
    local_28[0x16] = '\0';
    local_28[0x17] = '\0';
    iVar3 = snprintf(local_28,0x18,"%af",SUB84((double)local_2c,0));
    if (iVar3 != 0) {
      N = (size_t)iVar3;
      OutputStream::grow(s,N);
      memcpy(s->Buffer + s->CurrentPosition,local_28,N);
      s->CurrentPosition = s->CurrentPosition + N;
    }
  }
  return;
}

Assistant:

const char *end() const { return Last; }